

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O2

void nosimd::arithmetic::abs<short>(short *pSrc,short *pDst,int len)

{
  short sVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  short sVar4;
  
  uVar2 = 0;
  if (0 < len) {
    uVar2 = (ulong)(uint)len;
  }
  uVar3 = 0;
  if (pSrc == pDst) {
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (pDst[uVar3] < 0) {
        pDst[uVar3] = -pDst[uVar3];
      }
    }
  }
  else {
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      sVar1 = pSrc[uVar3];
      sVar4 = -sVar1;
      if (0 < sVar1) {
        sVar4 = sVar1;
      }
      pDst[uVar3] = sVar4;
    }
  }
  return;
}

Assistant:

inline void abs(const _T * pSrc, _T * pDst, int len)
        {
            if (pSrc == pDst)
            {
                for (int i = 0; i < len; ++i)
                    if (pDst[i] < 0)
                        pDst[i] = -pDst[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                {
                    if (pSrc[i] >= 0)
                        pDst[i] = pSrc[i];
                    else
                        pDst[i] = -pSrc[i];
                }
            }
        }